

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O2

pointer __thiscall
tcmalloc::STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::allocate
          (STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void> *this,size_type n,
          void *param_2)

{
  LogItem b;
  LogItem c;
  LogItem d;
  Entry *pEVar1;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  undefined4 uStack_2c;
  anon_union_8_4_e5b1a622_for_u_ aStack_28;
  undefined4 uStack_1c;
  anon_union_8_4_e5b1a622_for_u_ aStack_18;
  
  if (!underlying_.initialized) {
    PageHeapAllocator<tcmalloc::StackTraceTable::Entry>::Init(&underlying_.allocator);
    underlying_.initialized = true;
  }
  if (n == 1) {
    pEVar1 = PageHeapAllocator<tcmalloc::StackTraceTable::Entry>::New(&underlying_.allocator);
    return pEVar1;
  }
  d._4_4_ = uStack_1c;
  d.tag_ = 4;
  c._4_4_ = uStack_2c;
  c.tag_ = 4;
  b._4_4_ = uStack_3c;
  b.tag_ = 4;
  b.u_.str = aStack_38.str;
  c.u_.str = aStack_28.str;
  d.u_.str = aStack_18.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap_allocator.h"
      ,0xa2,(LogItem)(ZEXT816(0x1393f4) << 0x40),b,c,d);
  do {
  } while( true );
}

Assistant:

pointer allocate(size_type n, const void* = 0) {
    if (!underlying_.initialized) {
      underlying_.allocator.Init();
      underlying_.initialized = true;
    }

    CHECK_CONDITION(n == 1);
    return underlying_.allocator.New();
  }